

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUuid.cxx
# Opt level: O1

string * __thiscall
cmUuid::ByteToHex_abi_cxx11_(string *__return_storage_ptr__,cmUuid *this,uchar inputByte)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"  ","");
  uVar3 = 1;
  do {
    if (__return_storage_ptr__->_M_string_length <= uVar3) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    }
    bVar1 = inputByte & 0xf;
    cVar2 = bVar1 + 0x57;
    if (bVar1 < 10) {
      cVar2 = bVar1 + 0x30;
    }
    inputByte = inputByte >> 4;
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar3] = cVar2;
    uVar3 = uVar3 - 1;
  } while (uVar3 == 0);
  return __return_storage_ptr__;
}

Assistant:

std::string cmUuid::ByteToHex(unsigned char inputByte) const
{
  std::string result("  ");
  for (int i = 0; i < 2; ++i) {
    unsigned char rest = inputByte % 16;
    inputByte /= 16;
    char c = (rest < 0xA) ? static_cast<char>('0' + rest)
                          : static_cast<char>('a' + (rest - 0xA));
    result.at(1 - i) = c;
  }

  return result;
}